

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadnames.cpp
# Opt level: O0

string * util::ThreadGetInternalName_abi_cxx11_(void)

{
  string *in_RDI;
  long in_FS_OFFSET;
  string *__a;
  char *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffff0,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == this) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string util::ThreadGetInternalName() { return g_thread_name; }